

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O1

void __thiscall PointPseudoLog::test_method(PointPseudoLog *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Vector3d v;
  RealSpace R3;
  Point y;
  Point x;
  undefined **local_3a8;
  ulong uStack_3a0;
  undefined8 *local_398;
  char **local_390;
  undefined8 uStack_388;
  double local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  double local_358;
  undefined1 local_348;
  undefined8 local_340;
  shared_count sStack_338;
  double *local_330;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  code *local_2e0 [11];
  void *local_288;
  void *local_278;
  double *local_268;
  void *pvStack_260;
  void *local_250;
  undefined8 uStack_248;
  Ref local_140 [8];
  void *local_138;
  ConstSubPoint local_128 [272];
  
  mnf::RealSpace::RealSpace((RealSpace *)local_2e0,3);
  local_368 = 1.0;
  dStack_360 = 2.0;
  local_358 = 3.0;
  local_250 = (void *)0x0;
  uStack_248 = 0;
  pvStack_260 = (void *)0x3;
  local_268 = &local_368;
  mnf::Manifold::createPoint(local_140);
  free(local_250);
  sStack_338.pi_ = (sp_counted_base *)&DAT_4000000000000000;
  local_3a8 = (undefined **)0x0;
  uStack_3a0 = 0;
  local_390 = (char **)0x0;
  uStack_388 = 0;
  local_330 = &local_368;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  construct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ();
  mnf::Manifold::createPoint((Ref *)&local_268);
  free(local_390);
  mnf::Point::pseudoLog((Point *)&local_3a8);
  if (uStack_3a0 == 3) {
    local_378 = (double)*local_3a8;
    dStack_370 = (double)local_3a8[1];
    dVar1 = (double)local_3a8[2];
    free(local_3a8);
    local_2f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
    ;
    local_2e8 = "";
    local_300 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x70);
    dVar3 = dVar1 * dVar1 + dStack_370 * dStack_370 + local_378 * local_378;
    dVar2 = local_358 * local_358 + dStack_360 * dStack_360 + local_368 * local_368;
    if (dVar3 <= dVar2) {
      dVar2 = dVar3;
    }
    local_348 = (dVar1 + local_358) * (dVar1 + local_358) +
                (dStack_370 + dStack_360) * (dStack_370 + dStack_360) +
                (local_378 + local_368) * (local_378 + local_368) <= dVar2 * 1e-24;
    local_340 = 0;
    sStack_338.pi_ = (sp_counted_base *)0x0;
    local_390 = &local_310;
    local_310 = "res.isApprox(-v)";
    local_308 = "";
    uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
    local_3a8 = &PTR__lazy_ostream_00129c08;
    local_398 = &boost::unit_test::lazy_ostream::inst;
    local_320 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
    ;
    local_318 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_338);
    mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_250);
    free(pvStack_260);
    mnf::ConstSubPoint::~ConstSubPoint(local_128);
    free(local_138);
    local_2e0[0] = mnf::operator+;
    free(local_278);
    free(local_288);
    mnf::Manifold::~Manifold((Manifold *)local_2e0);
    return;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(PointPseudoLog)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);
  Point x = R3.createPoint(v);
  Point y = R3.createPoint(2 * v);
  Eigen::Vector3d res;
  res.setZero();
  res = y.pseudoLog(x);
  BOOST_CHECK(res.isApprox(-v));
}